

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall higan::TcpServer::~TcpServer(TcpServer *this)

{
  TcpServer *this_local;
  
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::~function
            (&this->newconnection_callback_);
  std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&,_higan::Buffer_*)>::~function
            (&this->message_callback_);
  std::
  map<int,_std::shared_ptr<higan::TcpConnection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>_>_>
  ::~map(&this->connection_map_);
  Acceptor::~Acceptor(&this->acceptor_);
  InetAddress::~InetAddress(&this->server_addr_);
  std::__cxx11::string::~string((string *)&this->server_name_);
  EventLoopThreadPool::~EventLoopThreadPool(&this->thread_pool_);
  return;
}

Assistant:

TcpServer::~TcpServer()
{

}